

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

QAnimationTimer * QAnimationTimer::instance(bool create)

{
  bool bVar1;
  long lVar2;
  QAnimationTimer *pQVar3;
  pointer pQVar4;
  byte in_DIL;
  QAnimationTimer *inst;
  QAnimationTimer *__p;
  QAnimationTimer *in_stack_ffffffffffffffe0;
  
  lVar2 = __tls_get_addr(&PTR_00bf6270);
  if (*(char *)(lVar2 + 0x80) == '\0') {
    lVar2 = __tls_get_addr(&PTR_00bf6270);
    __cxa_thread_atexit(std::unique_ptr<QAnimationTimer,_std::default_delete<QAnimationTimer>_>::
                        ~unique_ptr,lVar2 + 0x78,&__dso_handle);
    lVar2 = __tls_get_addr(&PTR_00bf6270);
    *(undefined1 *)(lVar2 + 0x80) = 1;
  }
  if ((in_DIL & 1) != 0) {
    __tls_get_addr(&PTR_00bf6270);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QAnimationTimer,_std::default_delete<QAnimationTimer>_> *)
                       0x669882);
    if (!bVar1) {
      pQVar3 = (QAnimationTimer *)operator_new(0x78);
      QAnimationTimer(in_stack_ffffffffffffffe0);
      __p = pQVar3;
      __tls_get_addr(&PTR_00bf6270);
      std::unique_ptr<QAnimationTimer,_std::default_delete<QAnimationTimer>_>::reset
                ((unique_ptr<QAnimationTimer,_std::default_delete<QAnimationTimer>_> *)
                 in_stack_ffffffffffffffe0,__p);
      return pQVar3;
    }
  }
  __tls_get_addr(&PTR_00bf6270);
  pQVar4 = std::unique_ptr<QAnimationTimer,_std::default_delete<QAnimationTimer>_>::get
                     ((unique_ptr<QAnimationTimer,_std::default_delete<QAnimationTimer>_> *)
                      in_stack_ffffffffffffffe0);
  return pQVar4;
}

Assistant:

QAnimationTimer *QAnimationTimer::instance(bool create)
{
    QAnimationTimer *inst;
#if QT_CONFIG(thread)
    static thread_local std::unique_ptr<QAnimationTimer> animationTimer;
    if (create && !animationTimer) {
        inst = new QAnimationTimer;
        animationTimer.reset(inst);
    } else {
        inst = animationTimer.get();
    }
#else
    Q_UNUSED(create);
    static QAnimationTimer animationTimer;
    inst = &animationTimer;
#endif
    return inst;
}